

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Function_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFuncDecl
          (Result<wasm::Function_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  Function *pFVar4;
  long *plVar5;
  uint uVar6;
  char *pcVar7;
  ulong *puVar8;
  ulong uVar9;
  ParseDeclsCtx *this_00;
  uint __len;
  ImportNames *pIVar10;
  string_view sVar11;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  ImportNames *local_70;
  Err local_68;
  Index local_44;
  ParseDeclsCtx *local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  local_70 = importNames;
  local_44 = pos;
  local_40 = this;
  pFVar4 = (Function *)operator_new(0x1d8);
  memset(pFVar4,0,0x1d8);
  HeapType::HeapType(&pFVar4->type,(Signature)ZEXT816(0));
  this_00 = local_40;
  pFVar4->profile = Normal;
  (pFVar4->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar4->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar4->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar4->body = (Expression *)0x0;
  (pFVar4->localNames)._M_h._M_buckets = &(pFVar4->localNames)._M_h._M_single_bucket;
  (pFVar4->localNames)._M_h._M_bucket_count = 1;
  (pFVar4->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pFVar4->localNames)._M_h._M_element_count = 0;
  (pFVar4->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pFVar4->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (pFVar4->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pFVar4->localIndices)._M_h._M_buckets = &(pFVar4->localIndices)._M_h._M_single_bucket;
  (pFVar4->localIndices)._M_h._M_bucket_count = 1;
  (pFVar4->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pFVar4->localIndices)._M_h._M_element_count = 0;
  (pFVar4->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pFVar4->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (pFVar4->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pFVar4->debugLocations)._M_h._M_buckets = &(pFVar4->debugLocations)._M_h._M_single_bucket;
  (pFVar4->debugLocations)._M_h._M_bucket_count = 1;
  (pFVar4->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pFVar4->debugLocations)._M_h._M_element_count = 0;
  (pFVar4->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pFVar4->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (pFVar4->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pFVar4->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (pFVar4->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  (pFVar4->expressionLocations)._M_h._M_buckets =
       &(pFVar4->expressionLocations)._M_h._M_single_bucket;
  (pFVar4->expressionLocations)._M_h._M_bucket_count = 1;
  (pFVar4->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pFVar4->expressionLocations)._M_h._M_element_count = 0;
  (pFVar4->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pFVar4->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (pFVar4->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pFVar4->delimiterLocations)._M_h._M_buckets = &(pFVar4->delimiterLocations)._M_h._M_single_bucket
  ;
  (pFVar4->delimiterLocations)._M_h._M_bucket_count = 1;
  (pFVar4->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pFVar4->delimiterLocations)._M_h._M_element_count = 0;
  (pFVar4->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(pFVar4->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
  (pFVar4->funcLocation).declarations = 0;
  (pFVar4->funcLocation).end = 0;
  (pFVar4->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  (pFVar4->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pFVar4->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pFVar4->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pFVar4->noFullInline = false;
  pFVar4->noPartialInline = false;
  local_38._M_head_impl = pFVar4;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = local_40->funcCounter;
    local_40->funcCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00b7881b;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00b7881b;
        }
        if (uVar6 < 10000) goto LAB_00b7881b;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00b7881b:
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_90[0]),__len,__val);
    pIVar10 = local_70;
    pcVar7 = "fimport$";
    if (local_70 == (ImportNames *)0x0) {
      pcVar7 = "";
    }
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,(ulong)pcVar7);
    paVar1 = &local_68.msg.field_2;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_68.msg.field_2._M_allocated_capacity = *puVar8;
      local_68.msg.field_2._8_8_ = plVar5[3];
      local_68.msg._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_68.msg.field_2._M_allocated_capacity = *puVar8;
      local_68.msg._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_68.msg._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    sVar11._M_str = (char *)0x0;
    sVar11._M_len = (size_t)local_68.msg._M_dataplus._M_p;
    sVar11 = IString::interned((IString *)local_68.msg._M_string_length,sVar11,SUB81(puVar8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.msg._M_dataplus._M_p,local_68.msg.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_40;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    sVar11 = (string_view)Names::getValidFunctionName(this_00->wasm,(Name)sVar11);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar11;
  }
  else {
    pFVar4 = Module::getFunctionOrNull(local_40->wasm,name);
    if (pFVar4 != (Function *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"repeated function name","");
      Lexer::err(&local_68,&this_00->in,(ulong)local_44,&local_b0);
      puVar8 = (ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Function_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Function_*,_wasm::Err> = puVar8;
      paVar1 = &local_68.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.msg._M_dataplus._M_p == paVar1) {
        *puVar8 = local_68.msg.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 0x18) =
             local_68.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Function_*,_wasm::Err> = local_68.msg._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 0x10) =
             local_68.msg.field_2._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 8) =
           local_68.msg._M_string_length;
      local_68.msg._M_string_length = 0;
      local_68.msg.field_2._M_allocated_capacity =
           local_68.msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 0x20) = '\x01';
      local_68.msg._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b78954;
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    pIVar10 = local_70;
  }
  if (pIVar10 != (ImportNames *)0x0) {
    pcVar7 = (pIVar10->mod).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (pIVar10->mod).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar7;
    pcVar7 = (pIVar10->nm).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (pIVar10->nm).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar7;
  }
  pFVar4 = Module::addFunction(this_00->wasm,
                               (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_38);
  *(Function **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Function_*,_wasm::Err> = pFVar4;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Function_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Function_*,_wasm::Err> + 0x20) = '\0';
LAB_00b78954:
  if (local_38._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Function*>
ParseDeclsCtx::addFuncDecl(Index pos, Name name, ImportNames* importNames) {
  auto f = std::make_unique<Function>();
  if (name.is()) {
    if (wasm.getFunctionOrNull(name)) {
      // TDOO: if the existing function is not explicitly named, fix its name
      // and continue.
      return in.err(pos, "repeated function name");
    }
    f->setExplicitName(name);
  } else {
    name = (importNames ? "fimport$" : "") + std::to_string(funcCounter++);
    name = Names::getValidFunctionName(wasm, name);
    f->name = name;
  }
  applyImportNames(*f, importNames);
  return wasm.addFunction(std::move(f));
}